

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar_p.h
# Opt level: O2

void __thiscall QTabBarPrivate::Tab::startAnimation(Tab *this,QTabBarPrivate *priv,int duration)

{
  undefined8 uVar1;
  bool bVar2;
  qsizetype qVar3;
  TabBarAnimation *pTVar4;
  long in_FS_OFFSET;
  QTabBarPrivate *local_58;
  QTabBarPrivate *local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = priv;
  bVar2 = isAnimated(priv);
  if (bVar2) {
    pTVar4 = (this->animation)._M_t.
             super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             ._M_t.
             super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl;
    if (pTVar4 == (TabBarAnimation *)0x0) {
      local_58 = (QTabBarPrivate *)this;
      std::make_unique<QTabBarPrivate::Tab::TabBarAnimation,QTabBarPrivate::Tab*,QTabBarPrivate*&>
                ((Tab **)&local_48.shared,&local_58);
      uVar1 = local_48.shared;
      local_48.shared = (PrivateShared *)0x0;
      pTVar4 = (this->animation)._M_t.
               super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl;
      (this->animation)._M_t.
      super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
      ._M_t.
      super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
      .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl =
           (TabBarAnimation *)uVar1;
      if (pTVar4 != (TabBarAnimation *)0x0) {
        (**(code **)(*(long *)pTVar4 + 0x20))();
        if ((Tab *)local_48.shared != (Tab *)0x0) {
          (**(code **)(*(long *)local_48.shared + 0x20))();
        }
      }
      pTVar4 = (this->animation)._M_t.
               super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl;
    }
    ::QVariant::QVariant((QVariant *)&local_48,this->dragOffset);
    QVariantAnimation::setStartValue((QVariant *)pTVar4);
    ::QVariant::~QVariant((QVariant *)&local_48);
    pTVar4 = (this->animation)._M_t.
             super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             ._M_t.
             super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl;
    ::QVariant::QVariant((QVariant *)&local_48,0);
    QVariantAnimation::setEndValue((QVariant *)pTVar4);
    ::QVariant::~QVariant((QVariant *)&local_48);
    QVariantAnimation::setDuration
              ((int)(this->animation)._M_t.
                    super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                    .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>.
                    _M_head_impl);
    QAbstractAnimation::start
              ((DeletionPolicy)
               (this->animation)._M_t.
               super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl);
  }
  else {
    local_48.shared = (PrivateShared *)this;
    qVar3 = QtPrivate::indexOf<QTabBarPrivate::Tab*,QTabBarPrivate::Tab*>
                      (&priv->tabList,(Tab **)&local_48.shared,0);
    moveTabFinished(priv,(int)qVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void startAnimation(QTabBarPrivate *priv, int duration) {
            if (!priv->isAnimated()) {
                priv->moveTabFinished(priv->tabList.indexOf(this));
                return;
            }
            if (!animation)
                animation = std::make_unique<TabBarAnimation>(this, priv);
            animation->setStartValue(dragOffset);
            animation->setEndValue(0);
            animation->setDuration(duration);
            animation->start();
        }